

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBAddRow_AVX2(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined1 auVar1 [32];
  bool bVar2;
  int iVar3;
  
  do {
    auVar1 = *(undefined1 (*) [32])src_argb0;
    src_argb0 = (uint8_t *)((long)src_argb0 + 0x20);
    auVar1 = vpaddusb_avx2(auVar1,*(undefined1 (*) [32])src_argb1);
    src_argb1 = (uint8_t *)((long)src_argb1 + 0x20);
    *(undefined1 (*) [32])dst_argb = auVar1;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar3 = width + -8;
    bVar2 = 7 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void ARGBAddRow_AVX2(const uint8_t* src_argb0,
                     const uint8_t* src_argb1,
                     uint8_t* dst_argb,
                     int width) {
  asm volatile(
      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "lea         0x20(%0),%0                   \n"
      "vpaddusb    (%1),%%ymm0,%%ymm0            \n"
      "lea         0x20(%1),%1                   \n"
      "vmovdqu     %%ymm0,(%2)                   \n"
      "lea         0x20(%2),%2                   \n"
      "sub         $0x8,%3                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb0),  // %0
        "+r"(src_argb1),  // %1
        "+r"(dst_argb),   // %2
        "+r"(width)       // %3
      :
      : "memory", "cc", "xmm0");
}